

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signal.h
# Opt level: O1

void __thiscall
gui::Signal<gui::Gui_*,_sf::RenderWindow_&,_const_sf::Vector2<unsigned_int>_&>::emit
          (Signal<gui::Gui_*,_sf::RenderWindow_&,_const_sf::Vector2<unsigned_int>_&> *this,
          Gui *funcArgs,RenderWindow *funcArgs_1,Vector2<unsigned_int> *funcArgs_2)

{
  Gui *in_RAX;
  _Rb_tree_node_base *p_Var1;
  Gui *local_38;
  
  if (this->enabled_ == true) {
    local_38 = in_RAX;
    for (p_Var1 = (this->callbacks_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var1 != &(this->callbacks_)._M_t._M_impl.super__Rb_tree_header;
        p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
      if (*(int *)&p_Var1[2]._M_parent == 0) {
        local_38 = funcArgs;
        if (p_Var1[1]._M_right == (_Base_ptr)0x0) goto LAB_0017c99f;
        (**(code **)(p_Var1 + 2))(&p_Var1[1]._M_parent,&local_38,funcArgs_1,funcArgs_2);
      }
      else {
        if (p_Var1[1]._M_right == (_Base_ptr)0x0) {
LAB_0017c99f:
          std::__throw_bad_function_call();
        }
        (**(code **)(p_Var1 + 2))();
      }
    }
  }
  return;
}

Assistant:

void emit(Targs... funcArgs) const {
        if (!enabled_) {
            return;
        }
        using Tag = typename Callback<Targs...>::Tag;
        for (const auto& c : callbacks_) {
            if (c.second.getTag() == Tag::withArgs) {
                c.second.template value<Tag::withArgs>()(funcArgs...);
            } else {
                c.second.template value<Tag::noArgs>()();
            }
        }
    }